

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions.hpp
# Opt level: O2

size_t std::experimental::detail::
       index_into_dynamic_dims<int,unsigned_long,unsigned_long,unsigned_long>
                 (int idx,unsigned_long head,unsigned_long tail,unsigned_long tail_1)

{
  size_t sVar1;
  int idx_00;
  
  if (idx != 0 && head == 0xffffffffffffffff) {
    sVar1 = index_into_dynamic_dims<int,unsigned_long,unsigned_long>(idx + -1,tail,tail_1);
    return sVar1 + 1;
  }
  idx_00 = idx + -1;
  if (idx == 0) {
    idx_00 = 0;
  }
  sVar1 = index_into_dynamic_dims<int,unsigned_long,unsigned_long>(idx_00,tail,tail_1);
  return sVar1;
}

Assistant:

inline constexpr std::size_t index_into_dynamic_dims(
    Idx idx, Head head, Tail... tail
    ) noexcept
{
    return
        // FIXME: Is idx != 0 needed
        ( head == dyn && idx != 0
        ? index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...) + 1
        : index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...)
        );
}